

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout.cpp
# Opt level: O0

QSizeF __thiscall
QGraphicsAnchorLayout::sizeHint(QGraphicsAnchorLayout *this,SizeHint which,QSizeF *constraint)

{
  const_reference pvVar1;
  QGraphicsAnchorLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  QSizeF QVar2;
  QGraphicsAnchorLayoutPrivate *d;
  qreal bottom;
  qreal right;
  qreal top;
  qreal left;
  QSizeF engineSizeHint;
  undefined8 in_stack_ffffffffffffff58;
  Orientation o;
  value_type_conflict4 w;
  size_type in_stack_ffffffffffffff68;
  QSizeF *this_00;
  array<double,_3UL> *in_stack_ffffffffffffff70;
  QSizeF local_48;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  QSizeF local_18;
  long local_8;
  
  o = (Orientation)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QGraphicsAnchorLayout *)0x936579);
  QGraphicsAnchorLayoutPrivate::calculateGraphs(in_RDI);
  local_18.wd = -NAN;
  local_18.ht = -NAN;
  QHVContainer<std::array<double,_3UL>_>::operator[]
            ((QHVContainer<std::array<double,_3UL>_> *)in_RDI,o);
  pvVar1 = std::array<double,_3UL>::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  w = *pvVar1;
  QHVContainer<std::array<double,_3UL>_>::operator[]
            ((QHVContainer<std::array<double,_3UL>_> *)in_RDI,(Orientation)((ulong)w >> 0x20));
  pvVar1 = std::array<double,_3UL>::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  this_00 = &local_18;
  QSizeF::QSizeF(this_00,w,*pvVar1);
  local_20 = -NAN;
  local_28 = -NAN;
  local_30 = -NAN;
  local_38 = -NAN;
  (*(in_RDI->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.
    _vptr_QGraphicsLayoutItemPrivate[3])(in_RDI,&local_20,&local_28,&local_30,&local_38);
  QSizeF::QSizeF(&local_48,local_20 + local_30,local_28 + local_38);
  QVar2 = ::operator+(this_00,(QSizeF *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QSizeF QGraphicsAnchorLayout::sizeHint(Qt::SizeHint which, const QSizeF &constraint) const
{
    Q_UNUSED(constraint);
    Q_D(const QGraphicsAnchorLayout);

    // Some setup calculations are delayed until the information is
    // actually needed, avoiding unnecessary recalculations when
    // adding multiple anchors.

    // sizeHint() / effectiveSizeHint() already have a cache
    // mechanism, using invalidate() to force recalculation. However
    // sizeHint() is called three times after invalidation (for max,
    // min and pref), but we just need do our setup once.

    const_cast<QGraphicsAnchorLayoutPrivate *>(d)->calculateGraphs();

    // ### apply constraint!
    QSizeF engineSizeHint{d->sizeHints[Qt::Horizontal][which],
                          d->sizeHints[Qt::Vertical][which]};

    qreal left, top, right, bottom;
    getContentsMargins(&left, &top, &right, &bottom);

    return engineSizeHint + QSizeF(left + right, top + bottom);
}